

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_channel<ymfm::opn_registers_base<false>_>::keyonoff
          (fm_channel<ymfm::opn_registers_base<false>_> *this,uint32_t states,keyon_type type,
          uint32_t chnum)

{
  fm_operator<ymfm::opn_registers_base<false>_> *this_00;
  uint32_t uVar1;
  uint local_20;
  uint32_t opnum;
  uint32_t chnum_local;
  keyon_type type_local;
  uint32_t states_local;
  fm_channel<ymfm::opn_registers_base<false>_> *this_local;
  
  local_20 = 0;
  while( true ) {
    uVar1 = array_size<ymfm::fm_operator<ymfm::opn_registers_base<false>>*,4>(&this->m_op);
    if (uVar1 <= local_20) break;
    if (this->m_op[local_20] != (fm_operator<ymfm::opn_registers_base<false>_> *)0x0) {
      this_00 = this->m_op[local_20];
      uVar1 = bitfield(states,local_20,1);
      fm_operator<ymfm::opn_registers_base<false>_>::keyonoff(this_00,uVar1,type);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void fm_channel<RegisterType>::keyonoff(uint32_t states, keyon_type type, uint32_t chnum)
{
	for (uint32_t opnum = 0; opnum < array_size(m_op); opnum++)
		if (m_op[opnum] != nullptr)
			m_op[opnum]->keyonoff(bitfield(states, opnum), type);

	if (debug::LOG_KEYON_EVENTS && ((debug::GLOBAL_FM_CHANNEL_MASK >> chnum) & 1) != 0)
		for (uint32_t opnum = 0; opnum < array_size(m_op); opnum++)
			if (m_op[opnum] != nullptr)
				debug::log_keyon("%c%s\n", bitfield(states, opnum) ? '+' : '-', m_regs.log_keyon(m_choffs, m_op[opnum]->opoffs()).c_str());
}